

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall ON_Material::RemoveColorAlphaValues(ON_Material *this)

{
  uint uVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1c;
  
  uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_ambient);
  ON_Color::ON_Color((ON_Color *)&local_1c,uVar1 & 0xffffff);
  (this->m_ambient).field_0 = local_1c;
  uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_diffuse);
  ON_Color::ON_Color((ON_Color *)&local_1c,uVar1 & 0xffffff);
  (this->m_diffuse).field_0 = local_1c;
  uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_emission);
  ON_Color::ON_Color((ON_Color *)&local_1c,uVar1 & 0xffffff);
  (this->m_emission).field_0 = local_1c;
  uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_specular);
  ON_Color::ON_Color((ON_Color *)&local_1c,uVar1 & 0xffffff);
  (this->m_specular).field_0 = local_1c;
  uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_reflection);
  ON_Color::ON_Color((ON_Color *)&local_1c,uVar1 & 0xffffff);
  (this->m_reflection).field_0 = local_1c;
  uVar1 = ON_Color::operator_cast_to_unsigned_int(&this->m_transparent);
  ON_Color::ON_Color((ON_Color *)&local_1c,uVar1 & 0xffffff);
  (this->m_transparent).field_0 = local_1c;
  return;
}

Assistant:

void ON_Material::RemoveColorAlphaValues(void)
{
  m_ambient = OnlyRGB(m_ambient);
  m_diffuse = OnlyRGB(m_diffuse);
  m_emission = OnlyRGB(m_emission);
  m_specular = OnlyRGB(m_specular);
  m_reflection = OnlyRGB(m_reflection);
  m_transparent = OnlyRGB(m_transparent);
  
}